

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_audio_chain.cpp
# Opt level: O0

void __thiscall Sample::~Sample(Sample *this)

{
  undefined8 *in_RDI;
  
  al_destroy_sample(*in_RDI);
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

Sample::~Sample()
{
   al_destroy_sample(spl);
}